

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextFragmentData>::position
          (QFragmentMapData<QTextFragmentData> *this,uint node,uint field)

{
  uint uVar1;
  Header *pHVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  
  pHVar2 = (this->field_0).head;
  puVar6 = (uint *)((ulong)node * 0x20 + (long)pHVar2);
  uVar4 = (ulong)field;
  uVar3 = puVar6[uVar4 + 4];
  uVar8 = (ulong)node;
  while( true ) {
    uVar1 = *puVar6;
    uVar5 = (ulong)uVar1;
    if (uVar5 == 0) break;
    puVar6 = (uint *)((long)pHVar2 + uVar5 * 0x20);
    iVar7 = (int)uVar8;
    uVar8 = (ulong)uVar1;
    if (*(int *)((long)pHVar2 + uVar5 * 0x20 + 8) == iVar7) {
      uVar3 = uVar3 + puVar6[uVar4 + 4] + puVar6[uVar4 + 5];
      uVar8 = uVar5;
    }
  }
  return uVar3;
}

Assistant:

inline uint position(uint node, uint field = 0) const {
        Q_ASSERT(field < Fragment::size_array_max);
        const Fragment *f = fragment(node);
        uint offset = f->size_left_array[field];
        while (f->parent) {
            uint p = f->parent;
            f = fragment(p);
            if (f->right == node)
                offset += f->size_left_array[field] + f->size_array[field];
            node = p;
        }
        return offset;
    }